

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O0

bool helics::isTimingCommand(ActionMessage *command)

{
  action_t aVar1;
  ActionMessage *in_RDI;
  bool local_1;
  
  aVar1 = ActionMessage::action(in_RDI);
  if (((((aVar1 == cmd_priority_disconnect) || (aVar1 == cmd_disconnect)) ||
       ((uint)(aVar1 + (cmd_route_ack|cmd_init)) < 4)) ||
      ((((aVar1 == cmd_exec_request || (aVar1 == cmd_exec_grant)) ||
        ((aVar1 == cmd_terminate_immediately ||
         ((aVar1 == cmd_time_grant || (aVar1 == cmd_timing_info)))))) || (aVar1 == cmd_time_request)
       ))) || (((aVar1 == cmd_error || (aVar1 == cmd_local_error)) || (aVar1 == cmd_global_error))))
  {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool isTimingCommand(const ActionMessage& command) noexcept
{
    switch (command.action()) {
        case CMD_DISCONNECT:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_CORE:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_FED:
        case CMD_TIME_GRANT:
        case CMD_TIME_REQUEST:
        case CMD_EXEC_GRANT:
        case CMD_EXEC_REQUEST:
        case CMD_PRIORITY_DISCONNECT:
        case CMD_TERMINATE_IMMEDIATELY:
        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
        case CMD_GLOBAL_ERROR:
        case CMD_TIMING_INFO:
            return true;
        default:
            return false;
    }
}